

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

string * dumpstrings_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t *buf,size_t len,size_t *usedlen)

{
  uint8_t uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool local_102;
  bool local_101;
  bool local_f9;
  undefined1 local_d8 [7];
  bool bNextIsEolChar;
  string local_b8;
  string local_98 [8];
  string escapecode;
  size_t sStack_70;
  bool bNeedsEscape;
  size_t i;
  allocator<char> local_51;
  string local_50 [8];
  string escaped;
  bool bThisIsEolChar;
  bool bQuoted;
  size_t *usedlen_local;
  size_t len_local;
  uint8_t *buf_local;
  string *result;
  
  escaped.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  escaped.field_2._M_local_buf[0xe] = '\0';
  escaped.field_2._M_local_buf[0xd] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"\n\r\t",&local_51);
  std::allocator<char>::~allocator(&local_51);
  sStack_70 = 0;
  do {
    if (len <= sStack_70) {
LAB_001674e1:
      if ((escaped.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
        escaped.field_2._M_local_buf[0xe] = '\0';
      }
      *usedlen = sStack_70;
      escaped.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::~string(local_50);
      if ((escaped.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    lVar3 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)(char)buf[sStack_70]);
    local_f9 = true;
    if ((lVar3 == -1) && (local_f9 = true, buf[sStack_70] != '\"')) {
      local_f9 = buf[sStack_70] == '\\';
    }
    escapecode.field_2._M_local_buf[0xf] = local_f9;
    iVar2 = isprint((uint)buf[sStack_70]);
    if ((iVar2 == 0) && ((escapecode.field_2._M_local_buf[0xf] & 1U) == 0)) {
      if ((escaped.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
        escaped.field_2._M_local_buf[0xe] = '\0';
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",");
      }
      stringformat_abi_cxx11_((string *)local_d8,"%02x",(ulong)buf[sStack_70]);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_d8);
      std::__cxx11::string::~string((string *)local_d8);
    }
    else {
      if ((escaped.field_2._M_local_buf[0xe] & 1U) == 0) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,",");
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
        escaped.field_2._M_local_buf[0xe] = '\x01';
      }
      if ((escapecode.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,buf[sStack_70]);
      }
      else {
        std::__cxx11::string::string(local_98);
        uVar1 = buf[sStack_70];
        if (uVar1 == '\t') {
          std::__cxx11::string::operator=(local_98,"\\t");
        }
        else if (uVar1 == '\n') {
          std::__cxx11::string::operator=(local_98,"\\n");
        }
        else if (uVar1 == '\r') {
          std::__cxx11::string::operator=(local_98,"\\r");
        }
        else if (uVar1 == '\"') {
          std::__cxx11::string::operator=(local_98,"\\\"");
        }
        else if (uVar1 == '\\') {
          std::__cxx11::string::operator=(local_98,"\\\\");
        }
        else {
          stringformat_abi_cxx11_(&local_b8,"\\x%02x",(ulong)buf[sStack_70]);
          std::__cxx11::string::operator=(local_98,(string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_98);
        std::__cxx11::string::~string(local_98);
      }
    }
    if (sStack_70 + 1 < len) {
      if (sStack_70 == 0) {
        local_101 = true;
        if ((*buf != '\n') && (local_101 = true, *buf != '\r')) {
          local_101 = *buf == '\0';
        }
        escaped.field_2._M_local_buf[0xd] = local_101;
      }
      local_102 = true;
      if ((buf[sStack_70 + 1] != '\n') && (local_102 = true, buf[sStack_70 + 1] != '\r')) {
        local_102 = buf[sStack_70 + 1] == '\0';
      }
      if (((escaped.field_2._M_local_buf[0xd] & 1U) != 0) && (local_102 == false)) {
        sStack_70 = sStack_70 + 1;
        goto LAB_001674e1;
      }
      escaped.field_2._M_local_buf[0xd] = local_102;
    }
    sStack_70 = sStack_70 + 1;
  } while( true );
}

Assistant:

std::string dumpstrings(const uint8_t *buf, size_t len, size_t &usedlen)
{
    std::string result;
    bool bQuoted= false;
    bool bThisIsEolChar= false;
    std::string escaped= "\n\r\t";

    size_t i;
    for (i=0 ; i<len ; i++)
    {
        bool bNeedsEscape= escaped.find((char)buf[i])!=escaped.npos 
            || buf[i]=='\"' 
            || buf[i]=='\\';

        if (isprint(buf[i]) || bNeedsEscape) {
            if (!bQuoted) {
                if (!result.empty())
                    result += ",";
                result += "\"";
                bQuoted= true;
            }
            if (bNeedsEscape) {
                std::string escapecode;
                switch(buf[i]) {
                    case '\n': escapecode= "\\n"; break;
                    case '\r': escapecode= "\\r"; break;
                    case '\t': escapecode= "\\t"; break;
                    case '\"': escapecode= "\\\""; break;
                    case '\\': escapecode= "\\\\"; break;
                    default:
                       escapecode= stringformat("\\x%02x", buf[i]);
                }
                result += escapecode;
            }
            else {
                result += (char) buf[i];
            }
        }
        else {
            if (bQuoted) {
                result += "\"";
                bQuoted= false;
            }
            if (!result.empty())
                result += ",";
            result += stringformat("%02x", buf[i]);
        }
        if (i+1<len) {
            if (i==0)
                bThisIsEolChar = (buf[i]==0x0a || buf[i]==0x0d || buf[i]==0);

            bool bNextIsEolChar= (buf[i+1]==0x0a || buf[i+1]==0x0d || buf[i+1]==0);
            if (bThisIsEolChar && !bNextIsEolChar) {
                i++;
                break;
            }
            bThisIsEolChar= bNextIsEolChar;
        }
    }

    if (bQuoted) {
        result += "\"";
        bQuoted= false;
    }

    usedlen= i;

    return result;
}